

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

void __thiscall
Centaurus::CharClass<wchar_t>::collect_borders
          (CharClass<wchar_t> *this,set<wchar_t,_std::less<wchar_t>,_std::allocator<wchar_t>_> *dest
          )

{
  pointer pRVar1;
  Range<wchar_t> *r;
  pointer pRVar2;
  wchar_t local_30;
  wchar_t local_2c;
  
  pRVar1 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar2 = (this->m_ranges).
                super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar2 != pRVar1; pRVar2 = pRVar2 + 1) {
    local_2c = pRVar2->m_start;
    std::
    _Rb_tree<wchar_t,_wchar_t,_std::_Identity<wchar_t>,_std::less<wchar_t>,_std::allocator<wchar_t>_>
    ::_M_insert_unique<wchar_t>
              ((_Rb_tree<wchar_t,_wchar_t,_std::_Identity<wchar_t>,_std::less<wchar_t>,_std::allocator<wchar_t>_>
                *)dest,&local_2c);
    local_30 = pRVar2->m_end;
    std::
    _Rb_tree<wchar_t,_wchar_t,_std::_Identity<wchar_t>,_std::less<wchar_t>,_std::allocator<wchar_t>_>
    ::_M_insert_unique<wchar_t>
              ((_Rb_tree<wchar_t,_wchar_t,_std::_Identity<wchar_t>,_std::less<wchar_t>,_std::allocator<wchar_t>_>
                *)dest,&local_30);
  }
  return;
}

Assistant:

void collect_borders(std::set<TCHAR>& dest) const
    {
        for (const auto& r : m_ranges)
        {
            dest.insert(r.start());
            dest.insert(r.end());
        }
    }